

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrumented_benchmark.cpp
# Opt level: O2

vector<double,_std::allocator<double>_> *
compute_averages(vector<double,_std::allocator<double>_> *__return_storage_ptr__,
                vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
                *allresults)

{
  pointer pvVar1;
  pointer pdVar2;
  double dVar3;
  undefined1 auVar4 [16];
  size_t z_1;
  long lVar5;
  long lVar6;
  long lVar7;
  size_t z;
  long lVar8;
  undefined1 in_ZMM0 [64];
  undefined1 auVar9 [16];
  undefined1 in_ZMM1 [64];
  allocator_type local_11;
  
  auVar9 = in_ZMM1._0_16_;
  pvVar1 = (allresults->
           super__Vector_base<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((allresults->
      super__Vector_base<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish == pvVar1) {
    (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
  }
  else {
    std::vector<double,_std::allocator<double>_>::vector
              (__return_storage_ptr__,
               (long)(pvVar1->
                     super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>).
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)(pvVar1->
                     super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>).
                     _M_impl.super__Vector_impl_data._M_start >> 3,&local_11);
    pvVar1 = (allresults->
             super__Vector_base<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    lVar5 = ((long)(allresults->
                   super__Vector_base<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1) / 0x18;
    pdVar2 = (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar6 = (long)(__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>).
                  _M_impl.super__Vector_impl_data._M_finish - (long)pdVar2 >> 3;
    for (lVar7 = 0; lVar7 != lVar5; lVar7 = lVar7 + 1) {
      for (lVar8 = 0; lVar6 != lVar8; lVar8 = lVar8 + 1) {
        auVar4 = vcvtusi2sd_avx512f(auVar9,*(undefined8 *)
                                            (*(long *)&pvVar1[lVar7].
                                                                                                              
                                                  super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>
                                                  ._M_impl.super__Vector_impl_data + lVar8 * 8));
        dVar3 = auVar4._0_8_ + pdVar2[lVar8];
        in_ZMM0 = ZEXT864((ulong)dVar3);
        pdVar2[lVar8] = dVar3;
      }
    }
    auVar9 = vcvtusi2sd_avx512f(in_ZMM0._0_16_,lVar5);
    for (lVar5 = 0; lVar6 != lVar5; lVar5 = lVar5 + 1) {
      pdVar2[lVar5] = pdVar2[lVar5] / auVar9._0_8_;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<double>
compute_averages(std::vector< std::vector<unsigned long long> > allresults) {
    if (allresults.size() == 0)
        return std::vector<double>();
    
    std::vector<double> answer(allresults[0].size());
    
    for (size_t k = 0; k < allresults.size(); k++) {
        assert(allresults[k].size() == answer.size());
        for (size_t z = 0; z < answer.size(); z++) {
            answer[z] += allresults[k][z];
        }
    }

    for (size_t z = 0; z < answer.size(); z++) {
        answer[z] /= allresults.size();
    }
    return answer;
}